

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal.cpp
# Opt level: O0

void __thiscall Signal::reset(Signal *this)

{
  code *pcVar1;
  int iVar2;
  Signal *this_local;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this->mdata);
  if (iVar2 != 0) {
    iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Signal.cpp"
                          ,0x34,"pthread_mutex_lock((pthread_mutex_t*)mdata) == 0");
    if (iVar2 != 0) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  this->signaled = false;
  iVar2 = pthread_mutex_unlock((pthread_mutex_t *)this->mdata);
  if (iVar2 != 0) {
    iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Signal.cpp"
                          ,0x36,"pthread_mutex_unlock((pthread_mutex_t*)mdata) == 0");
    if (iVar2 != 0) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  return;
}

Assistant:

void Signal::reset()
{
#ifdef _WIN32
  VERIFY(ResetEvent(handle));
#else
  VERIFY(pthread_mutex_lock((pthread_mutex_t*)mdata) == 0);
  signaled = false;
  VERIFY(pthread_mutex_unlock((pthread_mutex_t*)mdata) == 0);
#endif
}